

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5StorageDeleteAll(Fts5Storage *p)

{
  Fts5Config *pFVar1;
  int iVar2;
  
  pFVar1 = p->pConfig;
  p->bTotalsValid = 0;
  iVar2 = fts5ExecPrintf(pFVar1->db,(char **)0x0,
                         "DELETE FROM %Q.\'%q_data\';DELETE FROM %Q.\'%q_idx\';",pFVar1->zDb,
                         pFVar1->zName,pFVar1->zDb,pFVar1->zName);
  if ((iVar2 == 0) && (iVar2 = 0, pFVar1->bColumnsize != 0)) {
    iVar2 = fts5ExecPrintf(pFVar1->db,(char **)0x0,"DELETE FROM %Q.\'%q_docsize\';",pFVar1->zDb,
                           pFVar1->zName);
  }
  if ((iVar2 == 0) && (iVar2 = 0, pFVar1->eContent == 3)) {
    iVar2 = fts5ExecPrintf(pFVar1->db,(char **)0x0,"DELETE FROM %Q.\'%q_content\';",pFVar1->zDb,
                           pFVar1->zName);
  }
  if (iVar2 == 0) {
    iVar2 = sqlite3Fts5IndexReinit(p->pIndex);
  }
  if (iVar2 != 0) {
    return iVar2;
  }
  iVar2 = sqlite3Fts5StorageConfigValue(p,"version",(sqlite3_value *)0x0,4);
  return iVar2;
}

Assistant:

static int sqlite3Fts5StorageDeleteAll(Fts5Storage *p){
  Fts5Config *pConfig = p->pConfig;
  int rc;

  p->bTotalsValid = 0;

  /* Delete the contents of the %_data and %_docsize tables. */
  rc = fts5ExecPrintf(pConfig->db, 0,
      "DELETE FROM %Q.'%q_data';"
      "DELETE FROM %Q.'%q_idx';",
      pConfig->zDb, pConfig->zName,
      pConfig->zDb, pConfig->zName
  );
  if( rc==SQLITE_OK && pConfig->bColumnsize ){
    rc = fts5ExecPrintf(pConfig->db, 0,
        "DELETE FROM %Q.'%q_docsize';", pConfig->zDb, pConfig->zName
    );
  }

  if( rc==SQLITE_OK && pConfig->eContent==FTS5_CONTENT_UNINDEXED ){
    rc = fts5ExecPrintf(pConfig->db, 0,
        "DELETE FROM %Q.'%q_content';", pConfig->zDb, pConfig->zName
    );
  }

  /* Reinitialize the %_data table. This call creates the initial structure
  ** and averages records.  */
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5IndexReinit(p->pIndex);
  }
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5StorageConfigValue(p, "version", 0, FTS5_CURRENT_VERSION);
  }
  return rc;
}